

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall test_block60000_verification::test_method(test_block60000_verification *this)

{
  bool bVar1;
  lazy_ostream *prev;
  uint64_t in_stack_fffffffffffffe70;
  undefined8 uVar2;
  uint64_t in_stack_fffffffffffffe88;
  ethash_light_t light_00;
  undefined1 local_168 [8];
  ethash_h256_t in_stack_fffffffffffffea0;
  assertion_result local_128;
  basic_cstring<const_char> local_110;
  basic_cstring<const_char> local_100;
  undefined1 local_f0 [8];
  ethash_h256_t difficulty;
  undefined1 local_ad [8];
  ethash_return_value_t ret;
  undefined1 local_59 [33];
  undefined1 local_38 [8];
  ethash_h256_t seedhash;
  ethash_light_t light;
  test_block60000_verification *this_local;
  
  seedhash.b._24_8_ = ethash_light_new(in_stack_fffffffffffffe70);
  light_00 = (ethash_light_t)local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_59 + 1),
             "5fc898f16035bf5ac9c6d9077ae1e3d5fc1ecc3c9fd5bee8bb00e810fdacbaa0",
             (allocator *)light_00);
  stringToBlockhash((ethash_h256_t *)local_38,(string *)(local_59 + 1));
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  if (seedhash.b._24_8_ != 0) {
    difficulty.b[0x18] = local_38[0];
    difficulty.b[0x19] = local_38[1];
    difficulty.b[0x1a] = local_38[2];
    difficulty.b[0x1b] = local_38[3];
    difficulty.b[0x1c] = local_38[4];
    difficulty.b[0x1d] = local_38[5];
    difficulty.b[0x1e] = local_38[6];
    difficulty.b[0x1f] = local_38[7];
    ethash_light_compute(light_00,in_stack_fffffffffffffea0,in_stack_fffffffffffffe88);
    local_f0[0] = '%';
    local_f0[1] = 0xa6;
    local_f0[2] = '\x1e';
    local_f0[3] = '\0';
    local_f0[4] = '\0';
    local_f0[5] = '\0';
    local_f0[6] = '\0';
    local_f0[7] = '\0';
    difficulty.b[0] = '\0';
    difficulty.b[1] = '\0';
    difficulty.b[2] = '\0';
    difficulty.b[3] = '\0';
    difficulty.b[4] = '\0';
    difficulty.b[5] = '\0';
    difficulty.b[6] = '\0';
    difficulty.b[7] = '\0';
    difficulty.b[8] = '\0';
    difficulty.b[9] = '\0';
    difficulty.b[10] = '\0';
    difficulty.b[0xb] = '\0';
    difficulty.b[0xc] = '\0';
    difficulty.b[0xd] = '\0';
    difficulty.b[0xe] = '\0';
    difficulty.b[0xf] = '\0';
    difficulty.b[0x10] = '\0';
    difficulty.b[0x11] = '\0';
    difficulty.b[0x12] = '\0';
    difficulty.b[0x13] = '\0';
    difficulty.b[0x14] = '\0';
    difficulty.b[0x15] = '\0';
    difficulty.b[0x16] = '\0';
    difficulty.b[0x17] = '\0';
    do {
      uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_100,
                 "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
                 ,0x53);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_110);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_100,0x285,&local_110);
      bVar1 = ethash_check_difficulty((ethash_h256_t *)local_ad,(ethash_h256_t *)local_f0);
      boost::test_tools::assertion_result::assertion_result(&local_128,bVar1);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&stack0xfffffffffffffea8,
                 "ethash_check_difficulty(&ret.result, &difficulty)",0x31);
      boost::unit_test::operator<<
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)&stack0xfffffffffffffeb8,prev,
                 (basic_cstring<const_char> *)&stack0xfffffffffffffea8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
                 ,0x53);
      boost::test_tools::tt_detail::report_assertion
                (&local_128,&stack0xfffffffffffffeb8,local_168,0x285,2,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)&stack0xfffffffffffffeb8);
      boost::test_tools::assertion_result::~assertion_result(&local_128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    ethash_light_delete((ethash_light_t)0x14640b);
    return;
  }
  __assert_fail("light",
                "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
                ,0x27e,"void test_block60000_verification::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(test_block60000_verification) {
	// from POC-9 testnet, epoch 2
	ethash_light_t light = ethash_light_new(60000);
	ethash_h256_t seedhash = stringToBlockhash("5fc898f16035bf5ac9c6d9077ae1e3d5fc1ecc3c9fd5bee8bb00e810fdacbaa0");
	BOOST_ASSERT(light);
	ethash_return_value_t ret = ethash_light_compute(
		light,
		seedhash,
		0x50377003e5d830caU
	);
	ethash_h256_t difficulty = ethash_h256_static_init(0x25, 0xa6, 0x1e);
	BOOST_REQUIRE(ethash_check_difficulty(&ret.result, &difficulty));
	ethash_light_delete(light);
}